

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_oth.cc
# Opt level: O1

void * PEM_ASN1_read_bio(undefined1 *d2i,char *name,BIO *bp,void **x,undefined1 *cb,void *u)

{
  int iVar1;
  void *pvVar2;
  uchar *data;
  long len;
  uchar *p;
  uchar *local_30;
  long local_28;
  uchar *local_20;
  
  pvVar2 = (void *)0x0;
  local_20 = (uchar *)0x0;
  local_30 = (uchar *)0x0;
  iVar1 = PEM_bytes_read_bio(&local_30,&local_28,(char **)0x0,name,bp,cb,u);
  if (iVar1 != 0) {
    local_20 = local_30;
    pvVar2 = (void *)(*(code *)d2i)(x,&local_20,local_28);
    if (pvVar2 == (void *)0x0) {
      ERR_put_error(9,0,0xc,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_oth.cc"
                    ,0x29);
    }
    OPENSSL_free(local_30);
  }
  return pvVar2;
}

Assistant:

void *PEM_ASN1_read_bio(d2i_of_void *d2i, const char *name, BIO *bp, void **x,
                        pem_password_cb *cb, void *u) {
  const unsigned char *p = NULL;
  unsigned char *data = NULL;
  long len;
  char *ret = NULL;

  if (!PEM_bytes_read_bio(&data, &len, NULL, name, bp, cb, u)) {
    return NULL;
  }
  p = data;
  ret = reinterpret_cast<char *>(d2i(x, &p, len));
  if (ret == NULL) {
    OPENSSL_PUT_ERROR(PEM, ERR_R_ASN1_LIB);
  }
  OPENSSL_free(data);
  return ret;
}